

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<double>_>::PrepareZ
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *y,TPZFMatrix<Fad<double>_> *z,
          Fad<double> *beta,int opt)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  Vector<double> *this_00;
  ulong uVar15;
  long local_90;
  long local_70;
  Fad<double> local_50;
  
  lVar5 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar6 = (y->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar5,lVar6);
  if (0 < lVar6) {
    local_70 = 0;
    local_90 = 0;
    do {
      lVar7 = (z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      if ((lVar7 < 1) || ((z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= local_90))
      {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pFVar8 = z->fElem;
      local_50.val_ = 0.0;
      local_50.dx_.num_elts = 0;
      local_50.dx_.ptr_to_data = (double *)0x0;
      local_50.defaultVal = 0.0;
      dVar1 = beta->val_;
      Fad<double>::~Fad(&local_50);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        if (z != y) {
          memcpy(pFVar8 + lVar7 * local_90,
                 y->fElem + (y->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * local_90,
                 lVar5 << 5);
        }
        if (0 < lVar5) {
          lVar7 = (z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
          lVar14 = 0;
          do {
            if ((lVar7 <= lVar14) ||
               ((z->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= local_90)) {
              TPZFMatrix<Fad<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = lVar7 * local_90;
            pFVar8 = z->fElem + lVar10 + lVar14;
            uVar3 = (beta->dx_).num_elts;
            uVar12 = (ulong)uVar3;
            uVar4 = z->fElem[lVar10 + lVar14].dx_.num_elts;
            uVar15 = (ulong)uVar4;
            dVar1 = beta->val_;
            if (uVar12 == 0) {
              if ((uVar15 != 0) && (0 < (int)uVar4)) {
                pdVar9 = (pFVar8->dx_).ptr_to_data;
                uVar12 = 0;
                do {
                  pdVar9[uVar12] = pdVar9[uVar12] * dVar1;
                  uVar12 = uVar12 + 1;
                } while (uVar15 != uVar12);
              }
            }
            else {
              pdVar9 = (beta->dx_).ptr_to_data;
              if (uVar15 == 0) {
                (pFVar8->dx_).num_elts = uVar3;
                uVar15 = uVar12 * 8;
                if ((int)uVar3 < 0) {
                  uVar15 = 0xffffffffffffffff;
                }
                pdVar11 = (double *)operator_new__(uVar15);
                (pFVar8->dx_).ptr_to_data = pdVar11;
                if (0 < (int)uVar3) {
                  dVar2 = pFVar8->val_;
                  uVar15 = 0;
                  do {
                    pdVar11[uVar15] = pdVar9[uVar15] * dVar2;
                    uVar15 = uVar15 + 1;
                  } while (uVar12 != uVar15);
                }
              }
              else if (0 < (int)uVar4) {
                pdVar11 = (pFVar8->dx_).ptr_to_data;
                uVar12 = 0;
                do {
                  pdVar11[uVar12] = pFVar8->val_ * pdVar9[uVar12] + pdVar11[uVar12] * dVar1;
                  uVar12 = uVar12 + 1;
                } while (uVar15 != uVar12);
              }
            }
            pFVar8->val_ = dVar1 * pFVar8->val_;
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar5);
        }
      }
      else if (lVar5 != 0) {
        this_00 = (Vector<double> *)((long)&(pFVar8->dx_).num_elts + lVar7 * local_70);
        sVar13 = lVar5 << 5;
        do {
          this_00[-1].ptr_to_data = (double *)0x0;
          if (this_00->num_elts != 0) {
            local_50.val_ = 0.0;
            Vector<double>::operator=(this_00,&local_50.val_);
          }
          this_00 = this_00 + 2;
          sVar13 = sVar13 - 0x20;
        } while (sVar13 != 0);
      }
      local_90 = local_90 + 1;
      local_70 = local_70 + 0x20;
    } while (local_90 != lVar6);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}